

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_compiler.c
# Opt level: O0

void gravity_compiler_transfer(gravity_compiler_t *compiler,gravity_vm *vm)

{
  gravity_object_t *pgVar1;
  void **ppvVar2;
  size_t sVar3;
  gravity_object_t *obj_00;
  int iVar4;
  gravity_closure_t *closure;
  gravity_object_t *obj;
  size_t i;
  size_t count;
  gravity_vm *vm_local;
  gravity_compiler_t *compiler_local;
  
  if (compiler->objects != (void_r *)0x0) {
    gravity_gc_setenabled(vm,false);
    pgVar1 = (gravity_object_t *)compiler->objects->n;
    for (obj = (gravity_object_t *)0x0; obj < pgVar1;
        obj = (gravity_object_t *)((long)&obj->isa + 1)) {
      ppvVar2 = compiler->objects->p;
      sVar3 = compiler->objects->n;
      compiler->objects->n = sVar3 - 1;
      obj_00 = (gravity_object_t *)ppvVar2[sVar3 - 1];
      gravity_vm_transfer(vm,obj_00);
      if (((obj_00->isa == gravity_class_closure) && (*(long *)(obj_00->identifier + 0x38) != 0)) &&
         (iVar4 = strcmp(*(char **)(obj_00->identifier + 0x38),"$moduleinit"), iVar4 == 0)) {
        gravity_vm_initmodule(vm,(gravity_function_t *)obj_00->identifier);
      }
    }
    gravity_gc_setenabled(vm,true);
  }
  return;
}

Assistant:

void gravity_compiler_transfer(gravity_compiler_t *compiler, gravity_vm *vm) {
    if (!compiler->objects) return;

    // transfer each object from compiler mini VM to exec VM
    gravity_gc_setenabled(vm, false);
    size_t count = marray_size(*compiler->objects);
    for (size_t i=0; i<count; ++i) {
        gravity_object_t *obj = marray_pop(*compiler->objects);
        gravity_vm_transfer(vm, obj);
        if (!OBJECT_ISA_CLOSURE(obj)) continue;

        // $moduleinit closure needs to be explicitly initialized
        gravity_closure_t *closure = (gravity_closure_t *)obj;
        if ((closure->f->identifier) && strcmp(closure->f->identifier, INITMODULE_NAME) == 0) {
            // code is here because it does not make sense to add this overhead (that needs to be executed only once)
            // inside the gravity_vm_transfer callback which is called for each allocated object inside the VM
            gravity_vm_initmodule(vm, closure->f);
        }
    }

    gravity_gc_setenabled(vm, true);
}